

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O2

void * chck_lut_str_get(chck_lut *lut,char *str,size_t len)

{
  uint32_t uVar1;
  void *pvVar2;
  
  if ((lut != (chck_lut *)0x0) && (lut->hashstr != (_func_uint32_t_char_ptr_size_t *)0x0)) {
    uVar1 = (*lut->hashstr)(str,len);
    pvVar2 = lut_get_index(lut,(uint32_t)((ulong)uVar1 % lut->count));
    return pvVar2;
  }
  __assert_fail("lut && lut->hashstr",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                0x82,"void *chck_lut_str_get(struct chck_lut *, const char *, size_t)");
}

Assistant:

void*
chck_lut_str_get(struct chck_lut *lut, const char *str, size_t len)
{
   assert(lut && lut->hashstr);
   return lut_get_index(lut, lut->hashstr(str, len) % lut->count);
}